

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O0

_Bool mon_select(monster_race *race)

{
  byte bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  char *pcVar5;
  monster_race *race_local;
  
  bVar1 = player->themed_level;
  wVar3 = themed_level_index("Elemental");
  if ((uint)bVar1 == wVar3) {
    race_local._7_1_ = vault_aux_elemental(race);
  }
  else {
    bVar1 = player->themed_level;
    wVar3 = themed_level_index("Estolad");
    if (((uint)bVar1 != wVar3) ||
       (_Var2 = flag_has_dbg(race->flags,0xc,0x24,"race->flags","RF_PLAYER"), _Var2)) {
      if ((base_d_char[0] == '\0') ||
         (pcVar5 = strchr(base_d_char,race->base->d_char), pcVar5 != (char *)0x0)) {
        if (((select_current_level < L'(') &&
            (_Var2 = flag_has_dbg(race->flags,0xc,0x49,"race->flags","RF_UNDEAD"), _Var2)) &&
           (_Var2 = flag_has_dbg(race->flags,0xc,0x33,"race->flags","RF_INVISIBLE"), _Var2)) {
          race_local._7_1_ = false;
        }
        else {
          _Var2 = flag_has_dbg(race->flags,0xc,1,"race->flags","RF_UNIQUE");
          if (_Var2) {
            if ((allow_unique & 1U) == 0) {
              return false;
            }
            uVar4 = Rand_div(5);
            if (uVar4 != 0) {
              return false;
            }
          }
          race_local._7_1_ = true;
        }
      }
      else {
        race_local._7_1_ = false;
      }
    }
    else {
      race_local._7_1_ = false;
    }
  }
  return race_local._7_1_;
}

Assistant:

static bool mon_select(struct monster_race *race)
{
	/* Special case: Elemental war themed level. */
	if (player->themed_level == themed_level_index("Elemental")) {
		return (vault_aux_elemental(race));
	}

	/* Special case: Estolad themed level. */
	if (player->themed_level == themed_level_index("Estolad")) {
		if (!rf_has(race->flags, RF_PLAYER))
			return false;
	}

	/* Require that the monster symbol be correct. */
	if (base_d_char[0] != '\0') {
		if (strchr(base_d_char, race->base->d_char) == 0)
			return (false);
	}

	/* No invisible undead until deep. */
	if (select_current_level < 40 && rf_has(race->flags, RF_UNDEAD)
			&& rf_has(race->flags, RF_INVISIBLE))
		return (false);

	/* Usually decline unique monsters. */
	if (rf_has(race->flags, RF_UNIQUE)) {
		if (!allow_unique)
			return (false);
		else if (randint0(5) != 0)
			return (false);
	}

	/* Okay */
	return (true);
}